

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

ENetOutgoingCommand *
enet_peer_queue_outgoing_command
          (ENetPeer *peer,ENetProtocol *command,ENetPacket *packet,enet_uint32 offset,
          enet_uint16 length)

{
  ENetOutgoingCommand *outgoingCommand;
  enet_uint16 length_local;
  enet_uint32 offset_local;
  ENetPacket *packet_local;
  ENetProtocol *command_local;
  ENetPeer *peer_local;
  
  peer_local = (ENetPeer *)enet_malloc(0x60);
  if (peer_local == (ENetPeer *)0x0) {
    peer_local = (ENetPeer *)0x0;
  }
  else {
    memcpy((ENetProtocol *)&(peer_local->address).port,command,0x30);
    *(enet_uint32 *)&peer_local->outgoingSessionID = offset;
    *(enet_uint16 *)&(peer_local->address).host = length;
    *(ENetPacket **)&peer_local->incomingBandwidthThrottleEpoch = packet;
    if (packet != (ENetPacket *)0x0) {
      packet->referenceCount = packet->referenceCount + 1;
    }
    enet_peer_setup_outgoing_command(peer,(ENetOutgoingCommand *)peer_local);
  }
  return (ENetOutgoingCommand *)peer_local;
}

Assistant:

ENetOutgoingCommand *
enet_peer_queue_outgoing_command (ENetPeer * peer, const ENetProtocol * command, ENetPacket * packet, enet_uint32 offset, enet_uint16 length)
{
    ENetOutgoingCommand * outgoingCommand = (ENetOutgoingCommand *) enet_malloc (sizeof (ENetOutgoingCommand));
    if (outgoingCommand == NULL)
      return NULL;

    outgoingCommand -> command = * command;
    outgoingCommand -> fragmentOffset = offset;
    outgoingCommand -> fragmentLength = length;
    outgoingCommand -> packet = packet;
    if (packet != NULL)
      ++ packet -> referenceCount;

    enet_peer_setup_outgoing_command (peer, outgoingCommand);

    return outgoingCommand;
}